

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx)

{
  aom_codec_enc_cfg_t *cfg;
  av1_extracfg *extra_cfg;
  AV1EncoderConfig *oxcf;
  uint uVar1;
  bool bVar2;
  aom_codec_err_t aVar3;
  uint uVar4;
  int iVar5;
  aom_codec_err_t aVar6;
  aom_codec_alg_priv_t_conflict *ctx_00;
  ulong uVar7;
  AV1_PRIMARY *pAVar8;
  FIRSTPASS_STATS *pFVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  
  if (ctx->priv != (aom_codec_priv_t *)0x0) {
    return AOM_CODEC_OK;
  }
  ctx_00 = (aom_codec_alg_priv_t_conflict *)aom_calloc(1,0xb528);
  if (ctx_00 == (aom_codec_alg_priv_t_conflict *)0x0) {
    return AOM_CODEC_MEM_ERROR;
  }
  ctx->priv = (aom_codec_priv_t *)ctx_00;
  (ctx_00->base).init_flags = ctx->init_flags;
  cfg = &ctx_00->cfg;
  memcpy(cfg,(ctx->config).raw,0x388);
  (ctx->config).dec = (aom_codec_dec_cfg *)cfg;
  extra_cfg = &ctx_00->extra_cfg;
  memcpy(extra_cfg,&default_extra_cfg,600);
  uVar4 = (ctx_00->cfg).g_usage;
  if (uVar4 == 2) {
    (ctx_00->extra_cfg).enable_cdef = 0;
    (ctx_00->extra_cfg).qm_min = 4;
    (ctx_00->extra_cfg).qm_max = 10;
  }
  av1_initialize_enc(uVar4,(ctx_00->cfg).rc_end_usage);
  aVar3 = validate_config(ctx_00,cfg,extra_cfg);
  if (aVar3 != AOM_CODEC_OK) {
    return aVar3;
  }
  ctx_00->num_lap_buffers = 0;
  uVar4 = (ctx_00->cfg).g_timebase.den;
  (ctx_00->timestamp_ratio).den = uVar4;
  uVar15 = (long)(ctx_00->cfg).g_timebase.num * 10000000;
  (ctx_00->timestamp_ratio).num = uVar15;
  uVar12 = uVar15;
  if (0 < (int)uVar4) {
    uVar11 = (ulong)uVar4;
    uVar7 = uVar15;
    do {
      uVar12 = uVar11 & 0xffffffff;
      uVar11 = (long)uVar7 % (long)uVar12;
      uVar7 = uVar12;
    } while (0 < (long)uVar11);
  }
  (ctx_00->timestamp_ratio).num = (long)uVar15 / (long)(int)uVar12;
  (ctx_00->timestamp_ratio).den = (int)uVar4 / (int)uVar12;
  oxcf = &ctx_00->oxcf;
  set_encoder_config(oxcf,cfg,extra_cfg);
  iVar13 = 0;
  if ((((ctx_00->oxcf).rc_cfg.mode != AOM_CBR) &&
      (iVar13 = 0, (ctx_00->oxcf).pass == AOM_RC_ONE_PASS)) && ((ctx_00->oxcf).mode == '\0')) {
    iVar13 = (ctx_00->oxcf).kf_cfg.key_freq_max;
    uVar4 = 0x30;
    if (iVar13 < 0x21) {
      uVar4 = iVar13 + 0x10;
    }
    uVar1 = (ctx_00->cfg).g_lag_in_frames;
    if ((int)uVar1 < (int)uVar4) {
      uVar4 = uVar1;
    }
    ctx_00->num_lap_buffers = uVar4;
    iVar13 = 0x11;
    if ((int)(uVar1 - uVar4) < 0x11) {
      iVar13 = 0;
    }
  }
  (ctx_00->oxcf).use_highbitdepth = (_Bool)((byte)((uint)ctx->init_flags >> 0x12) & 1);
  ctx_00->monochrome_on_init = (ctx_00->cfg).monochrome != 0;
  pAVar8 = av1_create_primary_compressor(&(ctx_00->pkt_list).head,ctx_00->num_lap_buffers,oxcf);
  ctx_00->ppi = pAVar8;
  if (pAVar8 == (AV1_PRIMARY *)0x0) {
    return AOM_CODEC_MEM_ERROR;
  }
  iVar5 = 0x30;
  if (0 < ctx_00->num_lap_buffers) {
    iVar5 = ctx_00->num_lap_buffers + 1;
  }
  pFVar9 = (FIRSTPASS_STATS *)aom_calloc((long)iVar5,0xe8);
  ctx_00->frame_stats_buffer = pFVar9;
  aVar3 = AOM_CODEC_MEM_ERROR;
  if (pFVar9 != (FIRSTPASS_STATS *)0x0) {
    (ctx_00->stats_buf_context).stats_in_start = pFVar9;
    (ctx_00->stats_buf_context).stats_in_end = pFVar9;
    (ctx_00->stats_buf_context).stats_in_buf_end = pFVar9 + iVar5;
    pFVar9 = (FIRSTPASS_STATS *)aom_calloc(1,0xe8);
    (ctx_00->stats_buf_context).total_left_stats = pFVar9;
    if (pFVar9 != (FIRSTPASS_STATS *)0x0) {
      av1_twopass_zero_stats(pFVar9);
      pFVar9 = (FIRSTPASS_STATS *)aom_calloc(1,0xe8);
      (ctx_00->stats_buf_context).total_stats = pFVar9;
      bVar2 = false;
      if (pFVar9 != (FIRSTPASS_STATS *)0x0) {
        av1_twopass_zero_stats(pFVar9);
        bVar2 = true;
        aVar3 = AOM_CODEC_OK;
      }
      goto LAB_001815cd;
    }
  }
  bVar2 = false;
LAB_001815cd:
  if (bVar2) {
    iVar5 = ctx_00->num_lap_buffers;
    lVar10 = 0;
    iVar14 = 0;
    if (0 < iVar5) {
      iVar14 = iVar5;
    }
    uVar12 = 0x30;
    if (0 < iVar5) {
      uVar12 = (ulong)(iVar14 + 1);
    }
    uVar15 = 0;
    do {
      (ctx_00->ppi->twopass).frame_stats_arr[uVar15] =
           (FIRSTPASS_STATS *)((long)&ctx_00->frame_stats_buffer->frame + lVar10);
      uVar15 = uVar15 + 1;
      lVar10 = lVar10 + 0xe8;
    } while (uVar12 != uVar15);
    pAVar8 = ctx_00->ppi;
    (pAVar8->twopass).stats_buf_ctx = &ctx_00->stats_buf_context;
    aVar3 = AOM_CODEC_OK;
    aVar6 = av1_create_context_and_bufferpool
                      (pAVar8,pAVar8->parallel_cpi,&ctx_00->buffer_pool,oxcf,'\0',-1);
    if (aVar6 == AOM_CODEC_OK) {
      pAVar8 = ctx_00->ppi;
      (pAVar8->parallel_cpi[0]->twopass_frame).stats_in =
           ((pAVar8->twopass).stats_buf_ctx)->stats_in_start;
      pAVar8->cpi = pAVar8->parallel_cpi[0];
      if (ctx_00->num_lap_buffers != 0) {
        aVar3 = av1_create_context_and_bufferpool
                          (pAVar8,&pAVar8->cpi_lap,&ctx_00->buffer_pool_lap,oxcf,'\x01',iVar13);
        return aVar3;
      }
    }
    else {
      (ctx_00->base).err_detail = "av1_create_context_and_bufferpool() failed";
      aVar3 = aVar6;
    }
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx) {
  aom_codec_err_t res = AOM_CODEC_OK;

  if (ctx->priv == NULL) {
    aom_codec_alg_priv_t *const priv = aom_calloc(1, sizeof(*priv));
    if (priv == NULL) return AOM_CODEC_MEM_ERROR;

    ctx->priv = (aom_codec_priv_t *)priv;
    ctx->priv->init_flags = ctx->init_flags;

    // Update the reference to the config structure to an internal copy.
    assert(ctx->config.enc);
    priv->cfg = *ctx->config.enc;
    ctx->config.enc = &priv->cfg;

    priv->extra_cfg = default_extra_cfg;
    // Special handling:
    // By default, if omitted: --enable-cdef=1, --qm-min=5, and --qm-max=9
    // Here we set its default values to 0, 4, and 10 respectively when
    // --allintra is turned on.
    // However, if users set --enable-cdef, --qm-min, or --qm-max, either from
    // the command line or aom_codec_control(), the encoder still respects it.
    if (priv->cfg.g_usage == AOM_USAGE_ALL_INTRA) {
      // CDEF has been found to blur images, so it's disabled in all-intra mode
      priv->extra_cfg.enable_cdef = 0;
      // These QM min/max values have been found to be beneficial for images,
      // when used with an alternative QM formula (see
      // aom_get_qmlevel_allintra()).
      // These values could also be beneficial for other usage modes, but
      // further testing is required.
      priv->extra_cfg.qm_min = DEFAULT_QM_FIRST_ALLINTRA;
      priv->extra_cfg.qm_max = DEFAULT_QM_LAST_ALLINTRA;
    }
    av1_initialize_enc(priv->cfg.g_usage, priv->cfg.rc_end_usage);

    res = validate_config(priv, &priv->cfg, &priv->extra_cfg);

    if (res == AOM_CODEC_OK) {
      int *num_lap_buffers = &priv->num_lap_buffers;
      int lap_lag_in_frames = 0;
      *num_lap_buffers = 0;
      priv->timestamp_ratio.den = priv->cfg.g_timebase.den;
      priv->timestamp_ratio.num =
          (int64_t)priv->cfg.g_timebase.num * TICKS_PER_SEC;
      reduce_ratio(&priv->timestamp_ratio);

      set_encoder_config(&priv->oxcf, &priv->cfg, &priv->extra_cfg);
      if (priv->oxcf.rc_cfg.mode != AOM_CBR &&
          priv->oxcf.pass == AOM_RC_ONE_PASS && priv->oxcf.mode == GOOD) {
        // Enable look ahead - enabled for AOM_Q, AOM_CQ, AOM_VBR
        *num_lap_buffers =
            AOMMIN((int)priv->cfg.g_lag_in_frames,
                   AOMMIN(MAX_LAP_BUFFERS, priv->oxcf.kf_cfg.key_freq_max +
                                               SCENE_CUT_KEY_TEST_INTERVAL));
        if ((int)priv->cfg.g_lag_in_frames - (*num_lap_buffers) >=
            LAP_LAG_IN_FRAMES) {
          lap_lag_in_frames = LAP_LAG_IN_FRAMES;
        }
      }
      priv->oxcf.use_highbitdepth =
          (ctx->init_flags & AOM_CODEC_USE_HIGHBITDEPTH) ? 1 : 0;

      priv->monochrome_on_init = priv->cfg.monochrome;

      priv->ppi = av1_create_primary_compressor(&priv->pkt_list.head,
                                                *num_lap_buffers, &priv->oxcf);
      if (!priv->ppi) return AOM_CODEC_MEM_ERROR;

#if !CONFIG_REALTIME_ONLY
      res = create_stats_buffer(&priv->frame_stats_buffer,
                                &priv->stats_buf_context, *num_lap_buffers);
      if (res != AOM_CODEC_OK) return res;

      assert(MAX_LAP_BUFFERS >= MAX_LAG_BUFFERS);
      int size = get_stats_buf_size(*num_lap_buffers, MAX_LAG_BUFFERS);
      for (int i = 0; i < size; i++)
        priv->ppi->twopass.frame_stats_arr[i] = &priv->frame_stats_buffer[i];

      priv->ppi->twopass.stats_buf_ctx = &priv->stats_buf_context;
#endif

      assert(priv->ppi->num_fp_contexts >= 1);
      res = av1_create_context_and_bufferpool(
          priv->ppi, &priv->ppi->parallel_cpi[0], &priv->buffer_pool,
          &priv->oxcf, ENCODE_STAGE, -1);
      if (res != AOM_CODEC_OK) {
        priv->base.err_detail = "av1_create_context_and_bufferpool() failed";
        return res;
      }
#if !CONFIG_REALTIME_ONLY
      priv->ppi->parallel_cpi[0]->twopass_frame.stats_in =
          priv->ppi->twopass.stats_buf_ctx->stats_in_start;
#endif
      priv->ppi->cpi = priv->ppi->parallel_cpi[0];

      // Create another compressor if look ahead is enabled
      if (res == AOM_CODEC_OK && *num_lap_buffers) {
        res = av1_create_context_and_bufferpool(
            priv->ppi, &priv->ppi->cpi_lap, &priv->buffer_pool_lap, &priv->oxcf,
            LAP_STAGE, clamp(lap_lag_in_frames, 0, MAX_LAG_BUFFERS));
      }
    }
  }

  return res;
}